

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O1

void ngx_sort(void *base,size_t n,size_t size,_func_ngx_int_t_void_ptr_void_ptr *cmp)

{
  void *__dest;
  ngx_int_t nVar1;
  void *__src;
  long lVar2;
  void *__src_00;
  void *__dest_00;
  void *local_48;
  
  __dest = ngx_alloc(size,ngx_cycle->log);
  if (__dest == (void *)0x0) {
    return;
  }
  lVar2 = n * size;
  if (lVar2 - size != 0 && (long)size <= lVar2) {
    __src = (void *)((long)base + size);
    local_48 = base;
    do {
      memcpy(__dest,__src,size);
      __dest_00 = __src;
      __src_00 = local_48;
      while (base < __dest_00) {
        __dest_00 = (void *)((long)__src_00 + size);
        nVar1 = (*cmp)(__src_00,__dest);
        if (nVar1 < 1) break;
        memcpy(__dest_00,__src_00,size);
        __src_00 = (void *)((long)__src_00 - size);
        __dest_00 = (void *)((long)__src_00 + size);
      }
      memcpy(__dest_00,__dest,size);
      __src = (void *)((long)__src + size);
      local_48 = (void *)((long)local_48 + size);
    } while (__src < (void *)(lVar2 + (long)base));
  }
  free(__dest);
  return;
}

Assistant:

void
ngx_sort(void *base, size_t n, size_t size,
    ngx_int_t (*cmp)(const void *, const void *))
{
    u_char  *p1, *p2, *p;

    p = ngx_alloc(size, ngx_cycle->log);
    if (p == NULL) {
        return;
    }

    for (p1 = (u_char *) base + size;
         p1 < (u_char *) base + n * size;
         p1 += size)
    {
        ngx_memcpy(p, p1, size);

        for (p2 = p1;
             p2 > (u_char *) base && cmp(p2 - size, p) > 0;
             p2 -= size)
        {
            ngx_memcpy(p2, p2 - size, size);
        }

        ngx_memcpy(p2, p, size);
    }

    ngx_free(p);
}